

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O2

void __thiscall
Lib::
SkipList<Inferences::ALASCA::BinaryResolutionConf::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LDComparator>
::~SkipList(SkipList<Inferences::ALASCA::BinaryResolutionConf::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::LDComparator>
            *this)

{
  makeEmpty(this);
  Lib::free(this->_left);
  return;
}

Assistant:

~SkipList()
  {
    makeEmpty();
    deallocate(_left,SKIP_LIST_MAX_HEIGHT);
  }